

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

arith_uint256 * UintToArith256(uint256 *a)

{
  long lVar1;
  uint32_t uVar2;
  arith_uint256 *in_RDI;
  long in_FS_OFFSET;
  int x;
  arith_uint256 *b;
  base_blob<256U> *in_stack_ffffffffffffffc8;
  arith_uint256 *ptr;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = in_RDI;
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffffc8);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    base_blob<256U>::begin(in_stack_ffffffffffffffc8);
    uVar2 = ReadLE32((uchar *)ptr);
    (ptr->super_base_uint<256U>).pn[local_1c] = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 UintToArith256(const uint256 &a)
{
    arith_uint256 b;
    for(int x=0; x<b.WIDTH; ++x)
        b.pn[x] = ReadLE32(a.begin() + x*4);
    return b;
}